

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeChangeP4(Vdbe *p,int addr,char *zP4,int n)

{
  ushort uVar1;
  sqlite3 *db;
  Op *pOVar2;
  void *__src;
  char cVar3;
  VdbeFunc *__dest;
  char *pcVar4;
  uint n_00;
  _func_void_void_ptr **__dest_00;
  ulong __n;
  
  db = p->db;
  pOVar2 = p->aOp;
  if ((pOVar2 == (Op *)0x0) || (db->mallocFailed != '\0')) {
    if ((n != -10) && (n != -6)) {
      freeP4(db,n,zP4);
      return;
    }
  }
  else {
    if (addr < 0) {
      addr = p->nOp + -1;
    }
    freeP4(db,(int)pOVar2[addr].p4type,pOVar2[addr].p4.p);
    pOVar2[addr].p4.p = (void *)0x0;
    if (n == -0xe) {
      pOVar2[addr].p4.i = (int)zP4;
      pOVar2[addr].p4type = -0xe;
    }
    else if (zP4 == (char *)0x0) {
      pOVar2[addr].p4type = '\0';
    }
    else if (n == -0x10) {
      pOVar2[addr].p4.z = zP4;
      pOVar2[addr].p4type = -6;
    }
    else if (n == -10) {
      pOVar2[addr].p4.z = zP4;
      pOVar2[addr].p4type = -10;
      *(int *)(zP4 + 0x18) = *(int *)(zP4 + 0x18) + 1;
    }
    else if (n == -6) {
      uVar1 = *(ushort *)(zP4 + 10);
      __n = (ulong)uVar1;
      n_00 = (uint)uVar1 + (uint)uVar1 * 8 + 0x18;
      __dest = (VdbeFunc *)sqlite3Malloc(n_00);
      pOVar2[addr].p4.pVdbeFunc = __dest;
      if (__dest == (VdbeFunc *)0x0) {
        p->db->mallocFailed = '\x01';
        cVar3 = '\0';
      }
      else {
        memcpy(__dest,zP4,n_00 - __n);
        __src = __dest->apAux[0].pAux;
        __dest_00 = &__dest->apAux[0].xDelete + __n;
        __dest->apAux[0].pAux = __dest_00;
        memcpy(__dest_00,__src,__n);
        cVar3 = -6;
      }
      pOVar2[addr].p4type = cVar3;
    }
    else if (n < 0) {
      pOVar2[addr].p4.z = zP4;
      pOVar2[addr].p4type = (char)n;
    }
    else {
      if (n == 0) {
        n = sqlite3Strlen30(zP4);
      }
      pcVar4 = sqlite3DbStrNDup(p->db,zP4,n);
      pOVar2[addr].p4.z = pcVar4;
      pOVar2[addr].p4type = -1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeP4(Vdbe *p, int addr, const char *zP4, int n){
  Op *pOp;
  sqlite3 *db;
  assert( p!=0 );
  db = p->db;
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->aOp==0 || db->mallocFailed ){
    if ( n!=P4_KEYINFO && n!=P4_VTAB ) {
      freeP4(db, n, (void*)*(char**)&zP4);
    }
    return;
  }
  assert( p->nOp>0 );
  assert( addr<p->nOp );
  if( addr<0 ){
    addr = p->nOp - 1;
  }
  pOp = &p->aOp[addr];
  assert( pOp->p4type==P4_NOTUSED || pOp->p4type==P4_INT32 );
  freeP4(db, pOp->p4type, pOp->p4.p);
  pOp->p4.p = 0;
  if( n==P4_INT32 ){
    /* Note: this cast is safe, because the origin data point was an int
    ** that was cast to a (const char *). */
    pOp->p4.i = SQLITE_PTR_TO_INT(zP4);
    pOp->p4type = P4_INT32;
  }else if( zP4==0 ){
    pOp->p4.p = 0;
    pOp->p4type = P4_NOTUSED;
  }else if( n==P4_KEYINFO ){
    KeyInfo *pKeyInfo;
    int nField, nByte;

    nField = ((KeyInfo*)zP4)->nField;
    nByte = sizeof(*pKeyInfo) + (nField-1)*sizeof(pKeyInfo->aColl[0]) + nField;
    pKeyInfo = sqlite3DbMallocRaw(0, nByte);
    pOp->p4.pKeyInfo = pKeyInfo;
    if( pKeyInfo ){
      u8 *aSortOrder;
      memcpy((char*)pKeyInfo, zP4, nByte - nField);
      aSortOrder = pKeyInfo->aSortOrder;
      assert( aSortOrder!=0 );
      pKeyInfo->aSortOrder = (unsigned char*)&pKeyInfo->aColl[nField];
      memcpy(pKeyInfo->aSortOrder, aSortOrder, nField);
      pOp->p4type = P4_KEYINFO;
    }else{
      p->db->mallocFailed = 1;
      pOp->p4type = P4_NOTUSED;
    }
  }else if( n==P4_KEYINFO_HANDOFF ){
    pOp->p4.p = (void*)zP4;
    pOp->p4type = P4_KEYINFO;
  }else if( n==P4_VTAB ){
    pOp->p4.p = (void*)zP4;
    pOp->p4type = P4_VTAB;
    sqlite3VtabLock((VTable *)zP4);
    assert( ((VTable *)zP4)->db==p->db );
  }else if( n<0 ){
    pOp->p4.p = (void*)zP4;
    pOp->p4type = (signed char)n;
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}